

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O1

bool FileExpand::inflate(vector<unsigned_char,_std::allocator<unsigned_char>_> *out,uint8_t *data,
                        size_t dataSize)

{
  zlib_params params;
  filtering_ostream os;
  symmetric_filter<boost::iostreams::detail::zlib_decompressor_impl<std::allocator<char>_>,_std::allocator<char>_>
  local_180;
  zlib_params local_170;
  undefined1 local_158 [232];
  undefined8 auStack_70 [9];
  
  if (dataSize != 0 && data != (uint8_t *)0x0) {
    local_170.level = -1;
    local_170.method = 8;
    local_170.strategy = 0;
    local_170.noheader = false;
    local_170.calculate_crc = false;
    local_170.window_bits = -0xf;
    local_170.mem_level = 8;
    boost::iostreams::
    filtering_stream<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>,_boost::iostreams::public_>
    ::filtering_stream((filtering_stream<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>,_boost::iostreams::public_>
                        *)local_158);
    boost::iostreams::
    symmetric_filter<boost::iostreams::detail::zlib_decompressor_impl<std::allocator<char>_>,_std::allocator<char>_>
    ::symmetric_filter<boost::iostreams::zlib_params>(&local_180,0x1000,&local_170);
    boost::iostreams::detail::
    chain_base<boost::iostreams::chain<boost::iostreams::output,char,std::char_traits<char>,std::allocator<char>>,char,std::char_traits<char>,std::allocator<char>,boost::iostreams::output>
    ::push_impl<boost::iostreams::basic_zlib_decompressor<std::allocator<char>>>
              ((chain_base<boost::iostreams::chain<boost::iostreams::output,char,std::char_traits<char>,std::allocator<char>>,char,std::char_traits<char>,std::allocator<char>,boost::iostreams::output>
                *)local_158._8_8_,(basic_zlib_decompressor<std::allocator<char>_> *)&local_180,-1,-1
              );
    boost::detail::shared_count::~shared_count(&local_180.pimpl_.pn);
    local_180.pimpl_.px = (element_type *)out;
    boost::iostreams::detail::
    chain_base<boost::iostreams::chain<boost::iostreams::output,char,std::char_traits<char>,std::allocator<char>>,char,std::char_traits<char>,std::allocator<char>,boost::iostreams::output>
    ::
    push_impl<boost::iostreams::detail::output_iterator_adapter<boost::iostreams::output,char,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
              ((chain_base<boost::iostreams::chain<boost::iostreams::output,char,std::char_traits<char>,std::allocator<char>>,char,std::char_traits<char>,std::allocator<char>,boost::iostreams::output>
                *)local_158._8_8_,
               (output_iterator_adapter<boost::iostreams::output,_char,_std::back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                *)&local_180,-1,-1);
    (**(code **)(**(long **)((long)auStack_70 + (long)*(_func_int **)(local_158._0_8_ + -0x18)) +
                0x60))(*(long **)((long)auStack_70 + (long)*(_func_int **)(local_158._0_8_ + -0x18))
                       ,data,dataSize);
    boost::iostreams::
    filtering_stream<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>,_boost::iostreams::public_>
    ::~filtering_stream((filtering_stream<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>,_boost::iostreams::public_>
                         *)local_158,
                        &boost::iostreams::
                         filtering_stream<boost::iostreams::output,char,std::char_traits<char>,std::allocator<char>,boost::iostreams::public_>
                         ::VTT);
    std::ios_base::~ios_base((ios_base *)(local_158 + 0x28));
  }
  return true;
}

Assistant:

bool FileExpand::inflate(std::vector<uint8_t>& out, const uint8_t* data, size_t dataSize) {
	if (data && dataSize > 0) {
		try {
			boost::iostreams::zlib_params params;
			params.window_bits = -boost::iostreams::zlib::default_window_bits;
			
			boost::iostreams::filtering_ostream os;
			os.push(boost::iostreams::zlib_decompressor(params));
			os.push(std::back_inserter(out));
			
			boost::iostreams::write(os, reinterpret_cast<const char*>(data), dataSize);
		}
		catch (const std::exception& e) {
			return false;
		}
	}
	
	return true;
}